

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O3

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (StreamingConcatenationExpression *this,SampledValueFuncVisitor *visitor)

{
  pointer pSVar1;
  size_t sVar2;
  Expression *pEVar3;
  StreamExpression *stream;
  pointer pSVar4;
  
  sVar2 = (this->streams_)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pSVar4 = (this->streams_)._M_ptr;
    pSVar1 = pSVar4 + sVar2;
    do {
      pEVar3 = (pSVar4->operand).ptr;
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (pEVar3,pEVar3,visitor);
      pEVar3 = pSVar4->withExpr;
      if (pEVar3 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                  (pEVar3,pEVar3,visitor);
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  return;
}

Assistant:

std::span<const StreamExpression> streams() const { return streams_; }